

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3WalClose(Wal *pWal,sqlite3 *db,int sync_flags,int nBuf,u8 *zBuf)

{
  int local_34;
  int local_30;
  int bPersist;
  int isDelete;
  int rc;
  u8 *zBuf_local;
  int nBuf_local;
  int sync_flags_local;
  sqlite3 *db_local;
  Wal *pWal_local;
  
  bPersist = 0;
  if (pWal != (Wal *)0x0) {
    local_30 = 0;
    _isDelete = zBuf;
    zBuf_local._0_4_ = nBuf;
    zBuf_local._4_4_ = sync_flags;
    _nBuf_local = db;
    db_local = (sqlite3 *)pWal;
    if ((zBuf != (u8 *)0x0) && (bPersist = sqlite3OsLock(pWal->pDbFd,4), bPersist == 0)) {
      if (*(char *)((long)&db_local->szMmap + 7) == '\0') {
        *(undefined1 *)((long)&db_local->szMmap + 7) = 1;
      }
      bPersist = sqlite3WalCheckpoint
                           ((Wal *)db_local,_nBuf_local,0,(_func_int_void_ptr *)0x0,(void *)0x0,
                            zBuf_local._4_4_,(int)zBuf_local,_isDelete,(int *)0x0,(int *)0x0);
      if (bPersist == 0) {
        local_34 = -1;
        sqlite3OsFileControlHint((sqlite3_file *)db_local->pVdbe,10,&local_34);
        if (local_34 == 1) {
          if (-1 < (long)db_local->aDb) {
            walLimitSize((Wal *)db_local,0);
          }
        }
        else {
          local_30 = 1;
        }
      }
    }
    walIndexClose((Wal *)db_local,local_30);
    sqlite3OsClose((sqlite3_file *)db_local->pDfltColl);
    if (local_30 != 0) {
      sqlite3BeginBenignMalloc();
      sqlite3OsDelete(db_local->pVfs,*(char **)(db_local->aLimit + 4),0);
      sqlite3EndBenignMalloc();
    }
    sqlite3_free((void *)db_local->lastRowid);
    sqlite3_free(db_local);
  }
  return bPersist;
}

Assistant:

SQLITE_PRIVATE int sqlite3WalClose(
  Wal *pWal,                      /* Wal to close */
  sqlite3 *db,                    /* For interrupt flag */
  int sync_flags,                 /* Flags to pass to OsSync() (or 0) */
  int nBuf,
  u8 *zBuf                        /* Buffer of at least nBuf bytes */
){
  int rc = SQLITE_OK;
  if( pWal ){
    int isDelete = 0;             /* True to unlink wal and wal-index files */

    /* If an EXCLUSIVE lock can be obtained on the database file (using the
    ** ordinary, rollback-mode locking methods, this guarantees that the
    ** connection associated with this log file is the only connection to
    ** the database. In this case checkpoint the database and unlink both
    ** the wal and wal-index files.
    **
    ** The EXCLUSIVE lock is not released before returning.
    */
    if( zBuf!=0
     && SQLITE_OK==(rc = sqlite3OsLock(pWal->pDbFd, SQLITE_LOCK_EXCLUSIVE))
    ){
      if( pWal->exclusiveMode==WAL_NORMAL_MODE ){
        pWal->exclusiveMode = WAL_EXCLUSIVE_MODE;
      }
      rc = sqlite3WalCheckpoint(pWal, db, 
          SQLITE_CHECKPOINT_PASSIVE, 0, 0, sync_flags, nBuf, zBuf, 0, 0
      );
      if( rc==SQLITE_OK ){
        int bPersist = -1;
        sqlite3OsFileControlHint(
            pWal->pDbFd, SQLITE_FCNTL_PERSIST_WAL, &bPersist
        );
        if( bPersist!=1 ){
          /* Try to delete the WAL file if the checkpoint completed and
          ** fsyned (rc==SQLITE_OK) and if we are not in persistent-wal
          ** mode (!bPersist) */
          isDelete = 1;
        }else if( pWal->mxWalSize>=0 ){
          /* Try to truncate the WAL file to zero bytes if the checkpoint
          ** completed and fsynced (rc==SQLITE_OK) and we are in persistent
          ** WAL mode (bPersist) and if the PRAGMA journal_size_limit is a
          ** non-negative value (pWal->mxWalSize>=0).  Note that we truncate
          ** to zero bytes as truncating to the journal_size_limit might
          ** leave a corrupt WAL file on disk. */
          walLimitSize(pWal, 0);
        }
      }
    }

    walIndexClose(pWal, isDelete);
    sqlite3OsClose(pWal->pWalFd);
    if( isDelete ){
      sqlite3BeginBenignMalloc();
      sqlite3OsDelete(pWal->pVfs, pWal->zWalName, 0);
      sqlite3EndBenignMalloc();
    }
    WALTRACE(("WAL%p: closed\n", pWal));
    sqlite3_free((void *)pWal->apWiData);
    sqlite3_free(pWal);
  }
  return rc;
}